

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

QString * __thiscall
MakefileGenerator::fullBuildArgs(QString *__return_storage_ptr__,MakefileGenerator *this)

{
  QMakeProject *pQVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_e0;
  QArrayDataPointer<char16_t> local_c8 [2];
  ProString local_98;
  QStringView local_68;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QFile::fileName();
  fileFixify((QString *)&local_58,this,&local_98.m_string,(FileFixifyTypes)0x0,true);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if ((Data *)local_58.size != (Data *)0x0) {
    local_f8.d = (Data *)local_58.size;
    local_f8.ptr = local_58.ptr;
    pQVar1 = this->project;
    ProKey::ProKey((ProKey *)local_c8,"QMAKE_MAKEFILE");
    QMakeEvaluator::first(&local_98,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
    local_e0.d = (Data *)local_98.m_string.d.size;
    local_e0.ptr = local_98.m_string.d.ptr;
    local_68 = QStringView::mid((QStringView *)&local_e0,(long)local_98.m_offset,
                                (long)local_98.m_length);
    bVar4 = operator!=((QStringView *)&local_f8,&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_c8);
    if (bVar4) {
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(local_c8,this,&local_58);
      qVar2 = local_c8[0].size;
      local_98.m_string.d.size = (qsizetype)local_c8[0].ptr;
      local_98.m_string.d.ptr = (char16_t *)local_c8[0].d;
      local_98.m_string.d.d = (Data *)0x21cc10;
      local_c8[0].d = (Data *)0x0;
      local_c8[0].ptr = (char16_t *)0x0;
      local_c8[0].size = 0;
      qVar3 = local_c8[0].size;
      local_c8[0].size._0_4_ = (undefined4)qVar2;
      local_c8[0].size._4_4_ = SUB84(qVar2,4);
      local_98.m_offset = (undefined4)local_c8[0].size;
      local_98.m_length = local_c8[0].size._4_4_;
      local_c8[0].size = qVar3;
      ::operator+=(__return_storage_ptr__,(QStringBuilder<const_char_(&)[5],_QString> *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&local_98.m_string.d.ptr);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(local_c8);
    }
  }
  pQVar1 = this->project;
  local_f8.d = (pQVar1->m_projectFile).d.d;
  local_f8.ptr = (pQVar1->m_projectFile).d.ptr;
  local_f8.size = (pQVar1->m_projectFile).d.size;
  if (local_f8.d != (Data *)0x0) {
    LOCK();
    ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  fileFixify((QString *)&local_e0,this,(QString *)&local_f8,(FileFixifyTypes)0x0,true);
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(local_c8,this,&local_e0);
  qVar2 = local_c8[0].size;
  local_98.m_string.d.size = (qsizetype)local_c8[0].ptr;
  local_98.m_string.d.ptr = (char16_t *)local_c8[0].d;
  local_98.m_string.d.d = (Data *)0x21fe9e;
  local_c8[0].d = (Data *)0x0;
  local_c8[0].ptr = (char16_t *)0x0;
  local_c8[0].size = 0;
  qVar3 = local_c8[0].size;
  local_c8[0].size._0_4_ = (undefined4)qVar2;
  local_c8[0].size._4_4_ = SUB84(qVar2,4);
  local_98.m_offset = (undefined4)local_c8[0].size;
  local_98.m_length = local_c8[0].size._4_4_;
  local_c8[0].size = qVar3;
  ::operator+=(__return_storage_ptr__,(QStringBuilder<const_char_(&)[2],_QString> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&local_98.m_string.d.ptr);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  buildArgs(&local_98.m_string,this,true);
  QString::append((QString *)__return_storage_ptr__);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString MakefileGenerator::fullBuildArgs()
{
    QString ret;

    //output
    QString ofile = fileFixify(Option::output.fileName());
    if (!ofile.isEmpty() && ofile != project->first("QMAKE_MAKEFILE").toQStringView())
        ret += " -o " + escapeFilePath(ofile);

    //inputs
    ret += " " + escapeFilePath(fileFixify(project->projectFile()));

    // general options and arguments
    ret += buildArgs(true);

    return ret;
}